

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

void __thiscall
olc::PixelGameEngine::DrawPartialSprite
          (PixelGameEngine *this,int32_t x,int32_t y,Sprite *sprite,int32_t ox,int32_t oy,int32_t w,
          int32_t h,uint32_t scale,uint8_t flip)

{
  uint uVar1;
  Pixel PVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint32_t uVar12;
  int y_00;
  bool bVar13;
  
  if (sprite != (Sprite *)0x0) {
    uVar3 = -(flip & 1);
    uVar8 = w - 1U & uVar3;
    uVar3 = uVar3 | 1;
    uVar9 = h - 1U & (int)((uint)flip << 0x1e) >> 0x1f;
    iVar4 = 0;
    uVar1 = -(uint)((flip >> 1 & 1) != 0) | 1;
    if (h < 1) {
      h = iVar4;
    }
    if (w < 1) {
      w = iVar4;
    }
    if (scale < 2) {
      for (; iVar4 != w; iVar4 = iVar4 + 1) {
        uVar11 = y;
        y_00 = uVar9 + oy;
        iVar6 = h;
        while (bVar13 = iVar6 != 0, iVar6 = iVar6 + -1, bVar13) {
          PVar2 = Sprite::GetPixel(sprite,uVar8 + ox,y_00);
          (*this->_vptr_PixelGameEngine[5])(this,x + iVar4,(ulong)uVar11,(ulong)(uint)PVar2.field_0)
          ;
          y_00 = y_00 + uVar1;
          uVar11 = uVar11 + 1;
        }
        uVar8 = uVar8 + uVar3;
      }
    }
    else {
      for (iVar4 = 0; iVar4 != w; iVar4 = iVar4 + 1) {
        uVar7 = uVar9;
        uVar11 = y;
        for (iVar6 = 0; iVar6 != h; iVar6 = iVar6 + 1) {
          for (uVar5 = 0; uVar5 != scale; uVar5 = uVar5 + 1) {
            uVar12 = scale;
            uVar10 = uVar11;
            while (bVar13 = uVar12 != 0, uVar12 = uVar12 - 1, bVar13) {
              PVar2 = Sprite::GetPixel(sprite,uVar8 + ox,uVar7 + oy);
              (*this->_vptr_PixelGameEngine[5])
                        (this,(ulong)(iVar4 * scale + x + uVar5),(ulong)uVar10,
                         (ulong)(uint)PVar2.field_0);
              uVar10 = uVar10 + 1;
            }
          }
          uVar7 = uVar7 + uVar1;
          uVar11 = uVar11 + scale;
        }
        uVar8 = uVar8 + uVar3;
      }
    }
  }
  return;
}

Assistant:

void PixelGameEngine::DrawPartialSprite(int32_t x, int32_t y, Sprite *sprite, int32_t ox, int32_t oy, int32_t w, int32_t h, uint32_t scale, uint8_t flip)
	{
		if (sprite == nullptr)
			return;

		int32_t fxs = 0, fxm = 1, fx = 0;
		int32_t fys = 0, fym = 1, fy = 0;
		if (flip & olc::Sprite::Flip::HORIZ)
		{
			fxs = w - 1;
			fxm = -1;
		}
		if (flip & olc::Sprite::Flip::VERT)
		{
			fys = h - 1;
			fym = -1;
		}

		if (scale > 1)
		{
			fx = fxs;
			for (int32_t i = 0; i < w; i++, fx += fxm)
			{
				fy = fys;
				for (int32_t j = 0; j < h; j++, fy += fym)
					for (uint32_t is = 0; is < scale; is++)
						for (uint32_t js = 0; js < scale; js++)
							Draw(x + (i * scale) + is, y + (j * scale) + js, sprite->GetPixel(fx + ox, fy + oy));
			}
		}
		else
		{
			fx = fxs;
			for (int32_t i = 0; i < w; i++, fx += fxm)
			{
				fy = fys;
				for (int32_t j = 0; j < h; j++, fy += fym)
					Draw(x + i, y + j, sprite->GetPixel(fx + ox, fy + oy));
			}
		}
	}